

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

void __thiscall
mkvparser::ContentEncoding::ContentEncryption::~ContentEncryption(ContentEncryption *this)

{
  if (this->key_id != (uchar *)0x0) {
    operator_delete__(this->key_id);
  }
  if (this->signature != (uchar *)0x0) {
    operator_delete__(this->signature);
  }
  if (this->sig_key_id != (uchar *)0x0) {
    operator_delete__(this->sig_key_id);
    return;
  }
  return;
}

Assistant:

ContentEncoding::ContentEncryption::~ContentEncryption() {
  delete[] key_id;
  delete[] signature;
  delete[] sig_key_id;
}